

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::iterate(StorageAndSubImageTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  int iVar19;
  ContextType ctxType;
  ApiType requiredApiType;
  int iVar20;
  RenderContext *pRVar21;
  undefined4 extraout_var;
  ContextInfo *this_00;
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  Functions *gl;
  StorageAndSubImageTest *this_local;
  
  pRVar21 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar19 = (*pRVar21->_vptr_RenderContext[3])();
  pRVar21 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar21->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar1) || (bVar2)) {
    PrepareVertexArray(this);
    bVar1 = LoopTestOverDOverS<signed_char,false,false>(this,true);
    bVar2 = LoopTestOverDOverS<unsigned_char,false,false>(this,true);
    bVar3 = LoopTestOverDOverS<short,false,false>(this,true);
    bVar4 = LoopTestOverDOverS<unsigned_short,false,false>(this,true);
    bVar5 = LoopTestOverDOverS<int,false,false>(this,false);
    bVar6 = LoopTestOverDOverS<unsigned_int,false,false>(this,false);
    bVar7 = LoopTestOverDOverS<unsigned_char,true,false>(this,true);
    bVar8 = LoopTestOverDOverS<unsigned_short,true,false>(this,true);
    bVar9 = LoopTestOverDOverS<float,true,false>(this,false);
    bVar10 = LoopTestOverDOverS<signed_char,false,true>(this,true);
    bVar11 = LoopTestOverDOverS<unsigned_char,false,true>(this,true);
    bVar12 = LoopTestOverDOverS<short,false,true>(this,true);
    bVar13 = LoopTestOverDOverS<unsigned_short,false,true>(this,true);
    bVar14 = LoopTestOverDOverS<int,false,true>(this,false);
    bVar15 = LoopTestOverDOverS<unsigned_int,false,true>(this,false);
    bVar16 = LoopTestOverDOverS<unsigned_char,true,true>(this,true);
    bVar17 = LoopTestOverDOverS<unsigned_short,true,true>(this,true);
    bVar18 = LoopTestOverDOverS<float,true,true>(this,false);
    CleanTexture(this);
    CleanFramebuffer(this);
    CleanProgram(this);
    CleanErrors(this);
    CleanVertexArray(this);
    do {
      iVar20 = (**(code **)(CONCAT44(extraout_var,iVar19) + 0x800))();
    } while (iVar20 != 0);
    if ((bVar17 &&
        (bVar16 &&
        (bVar15 &&
        (bVar14 &&
        (bVar13 &&
        (bVar12 &&
        (bVar11 &&
        (bVar10 &&
        (bVar9 && (bVar8 && (bVar7 && (bVar6 && (bVar5 && (bVar4 && (bVar3 && (bVar2 && bVar1)))))))
        ))))))))) && bVar18) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult StorageAndSubImageTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		PrepareVertexArray();

		/* Test TextureStorage* */
		is_ok &= LoopTestOverDOverS<glw::GLbyte, false, false>(true);
		is_ok &= LoopTestOverDOverS<glw::GLubyte, false, false>(true);
		is_ok &= LoopTestOverDOverS<glw::GLshort, false, false>(true);
		is_ok &= LoopTestOverDOverS<glw::GLushort, false, false>(true);
		is_ok &= LoopTestOverDOverS<glw::GLint, false, false>(false);
		is_ok &= LoopTestOverDOverS<glw::GLuint, false, false>(false);
		is_ok &= LoopTestOverDOverS<glw::GLubyte, true, false>(true);
		is_ok &= LoopTestOverDOverS<glw::GLushort, true, false>(true);
		is_ok &= LoopTestOverDOverS<glw::GLfloat, true, false>(false);

		/* Test TextureSubImage* */
		is_ok &= LoopTestOverDOverS<glw::GLbyte, false, true>(true);
		is_ok &= LoopTestOverDOverS<glw::GLubyte, false, true>(true);
		is_ok &= LoopTestOverDOverS<glw::GLshort, false, true>(true);
		is_ok &= LoopTestOverDOverS<glw::GLushort, false, true>(true);
		is_ok &= LoopTestOverDOverS<glw::GLint, false, true>(false);
		is_ok &= LoopTestOverDOverS<glw::GLuint, false, true>(false);
		is_ok &= LoopTestOverDOverS<glw::GLubyte, true, true>(true);
		is_ok &= LoopTestOverDOverS<glw::GLushort, true, true>(true);
		is_ok &= LoopTestOverDOverS<glw::GLfloat, true, true>(false);
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	CleanTexture();
	CleanFramebuffer();
	CleanProgram();
	CleanErrors();
	CleanVertexArray();

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}